

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoke_test.cxx
# Opt level: O3

void local_sum(Block *b,ProxyWithLink *cp)

{
  size_t *psVar1;
  Link *pLVar2;
  pointer piVar3;
  CollectivesList *pCVar4;
  uint in_EAX;
  ostream *this;
  long *plVar5;
  mapped_type *pmVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  pointer pBVar12;
  long lVar13;
  int total;
  undefined8 uStack_38;
  
  pLVar2 = cp->link_;
  uStack_38 = (ulong)in_EAX;
  piVar3 = (b->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  lVar9 = (long)(b->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar3;
  if (lVar9 == 0) {
    iVar11 = 0;
  }
  else {
    uVar10 = 0;
    iVar11 = 0;
    do {
      iVar11 = iVar11 + piVar3[uVar10];
      uStack_38 = CONCAT44(iVar11,(undefined4)uStack_38);
      uVar10 = uVar10 + 1;
    } while ((uVar10 & 0xffffffff) < (ulong)(lVar9 >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total     (",0xb);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(cp->super_Proxy).gid_);
  std::__ostream_insert<char,std::char_traits<char>>(this,"): ",3);
  plVar5 = (long *)std::ostream::operator<<((ostream *)this,iVar11);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  pBVar12 = (pLVar2->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pLVar2->neighbors_).
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pBVar12) >> 3)) {
    lVar13 = 0;
    lVar9 = 0;
    do {
      pmVar6 = std::
               map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
               ::operator[](&(cp->super_Proxy).outgoing_,(key_type *)((long)&pBVar12->gid + lVar13))
      ;
      (*(pmVar6->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar6,(long)&uStack_38 + 4,4);
      lVar9 = lVar9 + 1;
      pBVar12 = (pLVar2->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 8;
    } while (lVar9 < (int)((ulong)((long)(pLVar2->neighbors_).
                                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar12)
                          >> 3));
    iVar11 = uStack_38._4_4_;
  }
  pCVar4 = (cp->super_Proxy).collectives_;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7->_M_next = (_List_node_base *)&PTR_init_00144a50;
  *(int *)&p_Var7->_M_prev = iVar11;
  p_Var8 = (_List_node_base *)operator_new(0x18);
  p_Var8[1]._M_next = p_Var7;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar1 = &(pCVar4->super_list<diy::Master::Collective,_std::allocator<diy::Master::Collective>_>).
            super__List_base<diy::Master::Collective,_std::allocator<diy::Master::Collective>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void local_sum(Block* b,                             // local block
               const diy::Master::ProxyWithLink& cp) // communication proxy
{
    diy::Link*    l = cp.link();

    // compute local sum
    int total = 0;
    for (unsigned i = 0; i < b->values.size(); ++i)
        total += b->values[i];

    std::cout << "Total     (" << cp.gid() << "): " << total        << std::endl;

    // for all neighbor blocks
    // enqueue data to be sent to this neighbor block in the next exchange
    for (int i = 0; i < l->size(); ++i)
        cp.enqueue(l->target(i), total);

    // diy collectives (optional) are piggybacking on the enqueue/exchange/dequeue mechanism.
    // They are invoked by posting the collective at the time of the enqueue and getting the
    // result at the time of the dequeue.
    // all_reduce() is the posting of the collective.
    cp.all_reduce(total, std::plus<int>());
}